

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O2

void sink(char *targ,char *src)

{
  bool bVar1;
  StripCtrlChars *sccpub;
  _Bool _Var2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  char *ptr;
  char *pcVar7;
  char *pcVar8;
  WFile *f;
  time_t start;
  time_t tVar9;
  ulong uVar10;
  ulong uVar11;
  long local_80a0;
  uint64_t local_8098;
  scp_sink_action act;
  char transbuf [32768];
  
  iVar3 = file_type(targ);
  if ((iVar3 != 2 & targetshouldbedirectory) == 1) {
    bump("%s: Not a directory",targ);
  }
  scp_sink_init();
  act.buf = strbuf_new();
  bVar1 = false;
  do {
    do {
      wVar4 = scp_get_sink_action(&act);
      if ((wVar4 != L'\0') || (act.action == L'\x03')) goto LAB_00112287;
    } while (act.action == L'\x04');
    pcVar7 = targ;
    if (iVar3 == 2) {
      pcVar7 = stripslashes(act.name,true);
      if (pcVar7 != act.name) {
        pcVar8 = stripctrl_string(string_scc,act.name);
        while (pcVar8 != (char *)0x0) {
          ptr = stripctrl_string(string_scc,pcVar7);
          while (ptr != (char *)0x0) {
            tell_user(_stderr,"warning: remote host sent a compound pathname \'%s\'",pcVar8);
            tell_user(_stderr,"         renaming local file to \'%s\'",ptr);
            safefree(ptr);
            ptr = (char *)0x0;
          }
          safefree(pcVar8);
          pcVar8 = (char *)0x0;
        }
      }
      _Var2 = is_dots(pcVar7);
      if (_Var2) {
        pcVar7 = "security violation: remote host attempted to write to a \'.\' or \'..\' path!";
LAB_001122b3:
        bump(pcVar7);
      }
      if (src != (char *)0x0) {
        pcVar8 = stripslashes(src,true);
        iVar5 = strcmp(pcVar7,pcVar8);
        if (((iVar5 != 0) && (using_sftp == false)) && (scp_unsafe_mode == '\0')) {
          pcVar7 = stripctrl_string(string_scc,pcVar7);
          while (pcVar7 != (char *)0x0) {
            tell_user(_stderr,"warning: remote host tried to write to a file called \'%s\'",pcVar7);
            safefree(pcVar7);
            pcVar7 = (char *)0x0;
          }
          tell_user(_stderr,"         when we requested a file called \'%s\'.",pcVar8);
          tell_user(_stderr,"         If this is a wildcard, consider upgrading to SSH-2 or using");
          tell_user(_stderr,
                    "         the \'-unsafe\' option. Renaming of this file has been disallowed.");
          pcVar7 = pcVar8;
        }
      }
      if (*targ == '\0') goto LAB_00111f2e;
      pcVar7 = dir_file_cat(targ,pcVar7);
    }
    else {
LAB_00111f2e:
      pcVar7 = dupstr(pcVar7);
    }
    iVar5 = file_type(pcVar7);
    if (act.action == L'\x02') {
      if (iVar5 == 0) {
        _Var2 = create_directory(pcVar7);
        if (_Var2) goto LAB_00111fe8;
        pcVar8 = stripctrl_string(string_scc,pcVar7);
        while (pcVar8 != (char *)0x0) {
          run_err("%s: Cannot create directory");
          safefree(pcVar8);
          pcVar8 = (char *)0x0;
        }
      }
      else if (iVar5 == 2) {
LAB_00111fe8:
        sink(pcVar7,(char *)0x0);
      }
      else {
        pcVar8 = stripctrl_string(string_scc,pcVar7);
        while (pcVar8 != (char *)0x0) {
          run_err("%s: Not a directory");
          safefree(pcVar8);
          pcVar8 = (char *)0x0;
        }
      }
    }
    else {
      f = open_new_file(pcVar7,act.permissions);
      if (f == (WFile *)0x0) {
        pcVar8 = stripctrl_string(string_scc,pcVar7);
        while (pcVar8 != (char *)0x0) {
          run_err("%s: Cannot create file");
          safefree(pcVar8);
          pcVar8 = (char *)0x0;
        }
      }
      else {
        wVar4 = scp_accept_filexfer();
        if (wVar4 != L'\0') {
          safefree(pcVar7);
          close_wfile(f);
LAB_00112287:
          strbuf_free(act.buf);
          return;
        }
        start = time((time_t *)0x0);
        sccpub = string_scc;
        pcVar8 = stripslashes(pcVar7,true);
        pcVar8 = stripctrl_string(sccpub,pcVar8);
        local_8098 = 0;
        local_80a0 = 0;
        for (uVar11 = 0; uVar10 = act.size - uVar11, uVar11 <= act.size && uVar10 != 0;
            uVar11 = uVar11 + uVar10) {
          if (0x7fff < uVar10) {
            uVar10 = 0x8000;
          }
          wVar4 = scp_recv_filedata(transbuf,(wchar_t)uVar10);
          if (wVar4 < L'\x01') {
            pcVar7 = "Lost connection";
            goto LAB_001122b3;
          }
          uVar10 = (ulong)(uint)wVar4;
          if (!bVar1) {
            wVar6 = write_to_file(f,transbuf,wVar4);
            if (wVar6 == wVar4) {
              if ((statistics & 1) == 0) {
                local_8098 = local_8098 + uVar10;
                tVar9 = time((time_t *)0x0);
                if ((local_80a0 < tVar9) || (uVar10 + uVar11 == act.size)) {
                  local_80a0 = time((time_t *)0x0);
                  print_stats(pcVar8,act.size,local_8098,start,local_80a0);
                }
              }
            }
            else {
              bVar1 = true;
              if ((statistics & 1) == 0) {
                printf("\r%-25.25s | %50s\n",pcVar8,"Write error.. waiting for end of file");
              }
            }
          }
        }
        if (act.settime == true) {
          set_file_times(f,act.mtime,act.atime);
        }
        close_wfile(f);
        if (bVar1) {
          pcVar8 = stripctrl_string(string_scc,pcVar7);
          while (pcVar8 != (char *)0x0) {
            run_err("%s: Write error");
            safefree(pcVar8);
            pcVar8 = (char *)0x0;
          }
        }
        else {
          scp_finish_filerecv();
          safefree(pcVar8);
        }
      }
    }
    safefree(pcVar7);
  } while( true );
}

Assistant:

static void sink(const char *targ, const char *src)
{
    char *destfname;
    bool targisdir = false;
    bool exists;
    int attr;
    WFile *f;
    uint64_t received;
    bool wrerror = false;
    uint64_t stat_bytes;
    time_t stat_starttime, stat_lasttime;
    char *stat_name;

    attr = file_type(targ);
    if (attr == FILE_TYPE_DIRECTORY)
        targisdir = true;

    if (targetshouldbedirectory && !targisdir)
        bump("%s: Not a directory", targ);

    scp_sink_init();

    struct scp_sink_action act;
    act.buf = strbuf_new();

    while (1) {

        if (scp_get_sink_action(&act))
            goto out;

        if (act.action == SCP_SINK_ENDDIR)
            goto out;

        if (act.action == SCP_SINK_RETRY)
            continue;

        if (targisdir) {
            /*
             * Prevent the remote side from maliciously writing to
             * files outside the target area by sending a filename
             * containing `../'. In fact, it shouldn't be sending
             * filenames with any slashes or colons in at all; so
             * we'll find the last slash, backslash or colon in the
             * filename and use only the part after that. (And
             * warn!)
             *
             * In addition, we also ensure here that if we're
             * copying a single file and the target is a directory
             * (common usage: `pscp host:filename .') the remote
             * can't send us a _different_ file name. We can
             * distinguish this case because `src' will be non-NULL
             * and the last component of that will fail to match
             * (the last component of) the name sent.
             *
             * Well, not always; if `src' is a wildcard, we do
             * expect to get back filenames that don't correspond
             * exactly to it. Ideally in this case, we would like
             * to ensure that the returned filename actually
             * matches the wildcard pattern - but one of SCP's
             * protocol infelicities is that wildcard matching is
             * done at the server end _by the server's rules_ and
             * so in general this is infeasible. Hence, we only
             * accept filenames that don't correspond to `src' if
             * unsafe mode is enabled or we are using SFTP (which
             * resolves remote wildcards on the client side and can
             * be trusted).
             */
            char *striptarget, *stripsrc;

            striptarget = stripslashes(act.name, true);
            if (striptarget != act.name) {
                with_stripctrl(sanname, act.name) {
                    with_stripctrl(santarg, striptarget) {
                        tell_user(stderr, "warning: remote host sent a"
                                  " compound pathname '%s'", sanname);
                        tell_user(stderr, "         renaming local"
                                  " file to '%s'", santarg);
                    }
                }
            }

            /*
             * Also check to see if the target filename is '.' or
             * '..', or indeed '...' and so on because Windows
             * appears to interpret those like '..'.
             */
            if (is_dots(striptarget)) {
                bump("security violation: remote host attempted to write to"
                     " a '.' or '..' path!");
            }

            if (src) {
                stripsrc = stripslashes(src, true);
                if (strcmp(striptarget, stripsrc) &&
                    !using_sftp && !scp_unsafe_mode) {
                    with_stripctrl(san, striptarget)
                        tell_user(stderr, "warning: remote host tried to "
                                  "write to a file called '%s'", san);
                    tell_user(stderr, "         when we requested a file "
                              "called '%s'.", stripsrc);
                    tell_user(stderr, "         If this is a wildcard, "
                              "consider upgrading to SSH-2 or using");
                    tell_user(stderr, "         the '-unsafe' option. Renaming"
                              " of this file has been disallowed.");
                    /* Override the name the server provided with our own. */
                    striptarget = stripsrc;
                }
            }

            if (targ[0] != '\0')
                destfname = dir_file_cat(targ, striptarget);
            else
                destfname = dupstr(striptarget);
        } else {
            /*
             * In this branch of the if, the target area is a
             * single file with an explicitly specified name in any
             * case, so there's no danger.
             */
            destfname = dupstr(targ);
        }
        attr = file_type(destfname);
        exists = (attr != FILE_TYPE_NONEXISTENT);

        if (act.action == SCP_SINK_DIR) {
            if (exists && attr != FILE_TYPE_DIRECTORY) {
                with_stripctrl(san, destfname)
                    run_err("%s: Not a directory", san);
                sfree(destfname);
                continue;
            }
            if (!exists) {
                if (!create_directory(destfname)) {
                    with_stripctrl(san, destfname)
                        run_err("%s: Cannot create directory", san);
                    sfree(destfname);
                    continue;
                }
            }
            sink(destfname, NULL);
            /* can we set the timestamp for directories ? */
            sfree(destfname);
            continue;
        }

        f = open_new_file(destfname, act.permissions);
        if (f == NULL) {
            with_stripctrl(san, destfname)
                run_err("%s: Cannot create file", san);
            sfree(destfname);
            continue;
        }

        if (scp_accept_filexfer()) {
            sfree(destfname);
            close_wfile(f);
            goto out;
        }

        stat_bytes = 0;
        stat_starttime = time(NULL);
        stat_lasttime = 0;
        stat_name = stripctrl_string(
            string_scc, stripslashes(destfname, true));

        received = 0;
        while (received < act.size) {
            char transbuf[32768];
            uint64_t blksize;
            int read;
            blksize = 32768;
            if (blksize > act.size - received)
                blksize = act.size - received;
            read = scp_recv_filedata(transbuf, (int)blksize);
            if (read <= 0)
                bump("Lost connection");
            if (wrerror) {
                received += read;
                continue;
            }
            if (write_to_file(f, transbuf, read) != (int)read) {
                wrerror = true;
                /* FIXME: in sftp we can actually abort the transfer */
                if (statistics)
                    printf("\r%-25.25s | %50s\n",
                           stat_name,
                           "Write error.. waiting for end of file");
                received += read;
                continue;
            }
            if (statistics) {
                stat_bytes += read;
                if (time(NULL) > stat_lasttime ||
                    received + read == act.size) {
                    stat_lasttime = time(NULL);
                    print_stats(stat_name, act.size, stat_bytes,
                                stat_starttime, stat_lasttime);
                }
            }
            received += read;
        }
        if (act.settime) {
            set_file_times(f, act.mtime, act.atime);
        }

        close_wfile(f);
        if (wrerror) {
            with_stripctrl(san, destfname)
                run_err("%s: Write error", san);
            sfree(destfname);
            continue;
        }
        (void) scp_finish_filerecv();
        sfree(stat_name);
        sfree(destfname);
    }
  out:
    strbuf_free(act.buf);
}